

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_half_to_float_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  uint8_t *puVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  uint uVar15;
  void *pvVar16;
  int iVar17;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    lVar7 = (long)(int)uVar2;
    puVar11 = (peVar4->field_12).decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    pvVar12 = decode->unpacked_buffer;
    lVar13 = (long)(int)(uVar2 * 8);
    pvVar14 = (void *)((long)pvVar12 + lVar7 * 2);
    pvVar8 = (void *)((long)pvVar12 + lVar7 * 4);
    pvVar16 = (void *)((long)pvVar12 + lVar7 * 6);
    iVar17 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar7 = 0;
        do {
          uVar9 = (uint)*(short *)((long)pvVar16 + lVar7);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar7 * 8) = uVar10;
          uVar9 = (uint)*(short *)((long)pvVar8 + lVar7);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar7 * 8 + 4) = uVar10;
          uVar9 = (uint)*(short *)((long)pvVar14 + lVar7);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar7 * 8 + 8) = uVar10;
          uVar9 = (uint)*(short *)((long)pvVar12 + lVar7);
          uVar15 = (uVar9 & 0x7fff) << 0xd;
          uVar10 = uVar9 & 0x80000000;
          if (uVar15 < 0x800000) {
            if ((uVar9 & 0x7fff) != 0) {
              uVar5 = 0x1f;
              if ((uVar9 & 0x7fff) != 0) {
                for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              iVar6 = (uVar5 ^ 0x1f) - 8;
              uVar10 = (uVar10 | uVar15 << ((byte)iVar6 & 0x1f) | 0x38800000) + iVar6 * -0x800000;
            }
          }
          else if (uVar15 < 0xf800000) {
            uVar10 = (uVar10 | uVar15) + 0x38000000;
          }
          else {
            uVar10 = uVar10 | uVar15 | 0x7f800000;
          }
          *(uint *)(puVar11 + lVar7 * 8 + 0xc) = uVar10;
          lVar7 = lVar7 + 2;
        } while ((ulong)uVar2 * 2 != lVar7);
      }
      pvVar12 = (void *)((long)pvVar12 + lVar13);
      puVar11 = puVar11 + iVar3;
      iVar17 = iVar17 + 1;
      pvVar14 = (void *)((long)pvVar14 + lVar13);
      pvVar8 = (void *)((long)pvVar8 + lVar13);
      pvVar16 = (void *)((long)pvVar16 + lVar13);
    } while (iVar17 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;
        in0        = (const uint16_t*) srcbuffer;
        in1        = in0 + w;
        in2        = in1 + w;
        in3        = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in3[x]));
            out[1] = half_to_float (one_to_native16 (in2[x]));
            out[2] = half_to_float (one_to_native16 (in1[x]));
            out[3] = half_to_float (one_to_native16 (in0[x]));
            out += 4;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}